

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::RoundDecimalOperator::Operation<long,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference this;
  undefined7 in_register_00000031;
  anon_class_16_2_0b9647cc fun;
  FunctionErrors in_stack_ffffffffffffffc8;
  long addition;
  long power_of_ten;
  
  power_of_ten = (&NumericHelper::POWERS_OF_TEN)[CONCAT71(in_register_00000031,scale) & 0xffffffff];
  addition = power_of_ten / 2;
  this = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  fun.power_of_ten = (long *)0x1;
  fun.addition = &power_of_ten;
  UnaryExecutor::
  Execute<long,long,duckdb::RoundDecimalOperator::Operation<long,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(long)_1_>
            ((UnaryExecutor *)this,result,*(Vector **)(input + 0x18),(idx_t)&addition,fun,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}